

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_points_tree_decoder.h
# Opt level: O0

bool __thiscall
draco::FloatPointsTreeDecoder::DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>
          (FloatPointsTreeDecoder *this,DecoderBuffer *buffer,
          PointAttributeVectorOutputIterator<float> *out)

{
  undefined1 uVar1;
  bool bVar2;
  DecoderBuffer *in_RDI;
  int8_t method_number;
  uint32_t decoded_version;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_> qpoints
  ;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  *in_stack_00001008;
  DecoderBuffer *in_stack_00001010;
  FloatPointsTreeDecoder *in_stack_00001018;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  *this_00;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
  local_38 [2];
  byte local_1;
  
  std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>::
  vector((vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
          *)0x1eedfa);
  uVar1 = DecoderBuffer::Decode<unsigned_int>
                    (in_RDI,(uint *)CONCAT17(in_stack_ffffffffffffff87,
                                             CONCAT16(in_stack_ffffffffffffff86,
                                                      CONCAT15(in_stack_ffffffffffffff85,
                                                               in_stack_ffffffffffffff80))));
  if (!(bool)uVar1) {
    local_1 = 0;
    goto LAB_001eefc0;
  }
  if (in_stack_ffffffffffffffc4 == 3) {
    bVar2 = DecoderBuffer::Decode<signed_char>
                      (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff87,
                                               CONCAT16(in_stack_ffffffffffffff86,
                                                        CONCAT15(in_stack_ffffffffffffff85,
                                                                 in_stack_ffffffffffffff80))));
    if (!bVar2) {
      local_1 = 0;
      goto LAB_001eefc0;
    }
    *(undefined1 *)&in_RDI->data_size_ = in_stack_ffffffffffffffaf;
    if ((char)in_RDI->data_size_ != '\x01') {
      fprintf(_stderr,"Method not supported. \n");
      local_1 = 0;
      goto LAB_001eefc0;
    }
    bVar2 = DecodePointCloudKdTreeInternal(in_stack_00001018,in_stack_00001010,in_stack_00001008);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_001eefc0;
    }
  }
  else {
    if (in_stack_ffffffffffffffc4 != 2) {
      fprintf(_stderr,"Version not supported. \n");
      local_1 = 0;
      goto LAB_001eefc0;
    }
    bVar2 = DecodePointCloudKdTreeInternal(in_stack_00001018,in_stack_00001010,in_stack_00001008);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_001eefc0;
    }
  }
  this_00 = local_38;
  std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>::
  begin(this_00);
  std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>::
  end(this_00);
  DequantizePoints3<__gnu_cxx::__normal_iterator<draco::VectorD<unsigned_int,3>*,std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::PointAttributeVectorOutputIterator<float>>
            ((__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,
             (QuantizationInfo *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (PointAttributeVectorOutputIterator<float> *)
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  local_1 = 1;
LAB_001eefc0:
  std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>::
  ~vector((vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>
           *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
  return (bool)(local_1 & 1);
}

Assistant:

bool FloatPointsTreeDecoder::DecodePointCloud(DecoderBuffer *buffer,
                                              OutputIteratorT &out) {
  std::vector<Point3ui> qpoints;

  uint32_t decoded_version;
  if (!buffer->Decode(&decoded_version)) {
    return false;
  }

  if (decoded_version == 3) {
    int8_t method_number;
    if (!buffer->Decode(&method_number)) {
      return false;
    }

    method_ = method_number;

    if (method_ == KDTREE) {
      if (!DecodePointCloudKdTreeInternal(buffer, &qpoints)) {
        return false;
      }
    } else {  // Unsupported method.
      fprintf(stderr, "Method not supported. \n");
      return false;
    }
  } else if (decoded_version == 2) {  // Version 2 only uses KDTREE method.
    if (!DecodePointCloudKdTreeInternal(buffer, &qpoints)) {
      return false;
    }
  } else {  // Unsupported version.
    fprintf(stderr, "Version not supported. \n");
    return false;
  }

  DequantizePoints3(qpoints.begin(), qpoints.end(), qinfo_, out);
  return true;
}